

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

int deqp::egl::SurfaceConfig::getColorComponentTypeRank(EGLenum compType)

{
  int iVar1;
  TestError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  EGLenum local_28;
  
  iVar1 = 0;
  if (compType != 0x333a) {
    if (compType != 0x333b) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Unknown color component type: ","");
      local_30 = eglu::getColorComponentTypeName;
      local_28 = compType;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_30);
      std::operator+(&local_50,&local_90,&local_70);
      tcu::TestError::TestError
                (this,local_50._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x98);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int getColorComponentTypeRank (EGLenum compType)
	{
		switch (compType)
		{
			case EGL_COLOR_COMPONENT_TYPE_FIXED_EXT:	return 0;
			case EGL_COLOR_COMPONENT_TYPE_FLOAT_EXT:	return 1;
			default:
				TCU_THROW(TestError, (std::string("Unknown color component type: ") + eglu::getColorComponentTypeStr(compType).toString()).c_str());
		}
	}